

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

void __thiscall tinyxml2::XMLDocument::PrintError(XMLDocument *this)

{
  char buf2 [20];
  char buf1 [20];
  
  if (this->_errorID != XML_NO_ERROR) {
    buf1[0x10] = '\0';
    buf1[0x11] = '\0';
    buf1[0x12] = '\0';
    buf1[0x13] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf1[0] = '\0';
    buf1[1] = '\0';
    buf1[2] = '\0';
    buf1[3] = '\0';
    buf1[4] = '\0';
    buf1[5] = '\0';
    buf1[6] = '\0';
    buf1[7] = '\0';
    buf1[8] = '\0';
    buf1[9] = '\0';
    buf1[10] = '\0';
    buf1[0xb] = '\0';
    buf1[0xc] = '\0';
    buf1[0xd] = '\0';
    buf1[0xe] = '\0';
    buf1[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    if (this->_errorStr1 != (char *)0x0) {
      snprintf(buf1,0x14,"%s");
    }
    if (this->_errorStr2 != (char *)0x0) {
      snprintf(buf2,0x14,"%s");
    }
    printf("XMLDocument error id=%d \'%s\' str1=%s str2=%s\n",(ulong)this->_errorID,
           *(undefined8 *)(_errorNames + (ulong)this->_errorID * 8),buf1,buf2);
  }
  return;
}

Assistant:

bool Error() const {
        return _errorID != XML_NO_ERROR;
    }